

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void cupdlp_diffDotDiff(CUPDLPwork *w,cupdlp_float *x1,cupdlp_float *x2,cupdlp_float *y1,
                       cupdlp_float *y2,cupdlp_int len,cupdlp_float *res)

{
  size_t __n;
  cupdlp_float *pcVar1;
  ulong uVar2;
  ulong uVar3;
  double dres;
  double dVar4;
  
  __n = (long)len * 8;
  memcpy(w->buffer2,x1,__n);
  if (len < 1) {
    memcpy(w->buffer3,y1,__n);
    dVar4 = 0.0;
  }
  else {
    pcVar1 = w->buffer2;
    uVar3 = (ulong)(uint)len;
    uVar2 = 0;
    do {
      pcVar1[uVar2] = pcVar1[uVar2] - x2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    memcpy(w->buffer3,y1,__n);
    pcVar1 = w->buffer3;
    uVar2 = 0;
    do {
      pcVar1[uVar2] = pcVar1[uVar2] - y2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      dVar4 = dVar4 + w->buffer2[uVar2] * pcVar1[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  *res = dVar4;
  return;
}

Assistant:

void cupdlp_diffDotDiff(CUPDLPwork *w, const cupdlp_float *x1,
                        const cupdlp_float *x2, const cupdlp_float *y1,
                        const cupdlp_float *y2, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x1, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, x2, w->buffer2);
  CUPDLP_COPY_VEC(w->buffer3, y1, cupdlp_float, len);
  cupdlp_axpy(w, len, &alpha, y2, w->buffer3);
  // reduce step
  cupdlp_dot(w, len, w->buffer2, w->buffer3, res);
}